

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O1

void __thiscall OpenMD::ForceManager::ForceManager(ForceManager *this,SimInfo *info)

{
  _Rb_tree_header *p_Var1;
  InteractionManager *this_00;
  ForceMatrixDecomposition *this_01;
  Thermo *pTVar2;
  
  this->_vptr_ForceManager = (_func_int **)&PTR__ForceManager_002fbde8;
  this->axis_ = 0;
  this->initialized_ = false;
  this->doParticlePot_ = false;
  this->doElectricField_ = false;
  this->doSitePotential_ = false;
  this->doHeatFlux_ = false;
  this->doLongRangeCorrections_ = false;
  this->usePeriodicBoundaryConditions_ = false;
  this->useSurfaceTerm_ = false;
  this->useSlabGeometry_ = false;
  this->info_ = info;
  p_Var1 = &(this->atomTypes_)._M_t._M_impl.super__Rb_tree_header;
  (this->atomTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->atomTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->forceField_ = (ForceField *)0x0;
  this->interactionMan_ = (InteractionManager *)0x0;
  this->fDecomp_ = (ForceDecomposition *)0x0;
  this->switcher_ = (SwitchingFunction *)0x0;
  this->thermo = (Thermo *)0x0;
  (this->atomTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->atomTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->bendDataSets)._M_t._M_impl.super__Rb_tree_header;
  (this->bendDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bendDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->atomTypes_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->interactions_).
  super__Vector_base<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>,_std::allocator<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->interactions_).
  super__Vector_base<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>,_std::allocator<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->interactions_).
  super__Vector_base<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>,_std::allocator<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bendDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bendDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->bendDataSets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header;
  (this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header;
  (this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  memset(&(this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0xe1);
  (this->selectionScript_)._M_dataplus._M_p = (pointer)&(this->selectionScript_).field_2;
  (this->selectionScript_)._M_string_length = 0;
  (this->selectionScript_).field_2._M_local_buf[0] = '\0';
  SelectionManager::SelectionManager(&this->seleMan_,info);
  SelectionEvaluator::SelectionEvaluator(&this->evaluator_,info);
  (this->idat).atid1 = -1;
  (this->idat).atid2 = -1;
  (this->idat).d.super_Vector<double,_3U>.data_[0] = 0.0;
  (this->idat).d.super_Vector<double,_3U>.data_[1] = 0.0;
  (this->idat).d.super_Vector<double,_3U>.data_[2] = 0.0;
  (this->idat).rij = 0.0;
  (this->idat).r2 = 0.0;
  (this->idat).rcut = 0.0;
  (this->idat).shiftedPot = false;
  (this->idat).shiftedForce = false;
  (this->idat).sw = 0.0;
  *(undefined8 *)((long)&(this->idat).sw + 6) = 0;
  memset(&(this->idat).vdwMult,0,0x8c);
  (this->sdat).skippedCharge = 0.0;
  (this->sdat).selfPot.data_[0] = 0.0;
  (this->sdat).selfPot.data_[1] = 0.0;
  (this->sdat).selfPot.data_[2] = 0.0;
  (this->sdat).selfPot.data_[3] = 0.0;
  (this->sdat).selfPot.data_[4] = 0.0;
  (this->sdat).selfPot.data_[5] = 0.0;
  (this->sdat).selfPot.data_[6] = 0.0;
  (this->sdat).doParticlePot = false;
  (this->sdat).particlePot = 0.0;
  (this->sdat).rho = 0.0;
  (this->sdat).frho = 0.0;
  (this->sdat).dfrhodrho = 0.0;
  (this->sdat).flucQ = 0.0;
  (this->sdat).flucQfrc = 0.0;
  (this->sdat).isSelected = false;
  (this->sdat).selePot.data_[0] = 0.0;
  (this->sdat).selePot.data_[1] = 0.0;
  (this->sdat).selePot.data_[2] = 0.0;
  (this->sdat).selePot.data_[3] = 0.0;
  (this->sdat).selePot.data_[4] = 0.0;
  (this->sdat).selePot.data_[5] = 0.0;
  (this->sdat).selePot.data_[6] = 0.0;
  memset(&(this->idat).selePot,0,0x284);
  this->forceField_ = this->info_->forceField_;
  this_00 = (InteractionManager *)operator_new(0x140);
  InteractionManager::InteractionManager(this_00);
  this->interactionMan_ = this_00;
  this_01 = (ForceMatrixDecomposition *)operator_new(0x318);
  ForceMatrixDecomposition::ForceMatrixDecomposition(this_01,this->info_,this_00);
  this->fDecomp_ = (ForceDecomposition *)this_01;
  pTVar2 = (Thermo *)operator_new(8);
  pTVar2->info_ = this->info_;
  this->thermo = pTVar2;
  return;
}

Assistant:

ForceManager::ForceManager(SimInfo* info) :
      initialized_(false), info_(info), switcher_(NULL), seleMan_(info),
      evaluator_(info) {
    forceField_     = info_->getForceField();
    interactionMan_ = new InteractionManager();
    fDecomp_        = new ForceMatrixDecomposition(info_, interactionMan_);
    thermo          = new Thermo(info_);
  }